

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O3

obj * oname(obj *obj,char *name)

{
  boolean bVar1;
  size_t sVar2;
  uint oname_size;
  char buf [63];
  char acStack_68 [62];
  undefined1 local_2a;
  
  if (*name == '\0') {
    if (obj->oartifact != '\0') {
      return obj;
    }
LAB_0017c9b5:
    if (obj->onamelth != '\0') {
      obj = realloc_obj(obj,(int)obj->oxlth,obj->oextra,0,name);
    }
  }
  else {
    sVar2 = strlen(name);
    oname_size = (int)sVar2 + 1;
    if ((int)oname_size < 0x40) {
      if (obj->oartifact != '\0') {
        return obj;
      }
      if (oname_size == 0) goto LAB_0017c9b5;
    }
    else {
      strncpy(acStack_68,name,0x3e);
      local_2a = 0;
      if (obj->oartifact != '\0') {
        return obj;
      }
      oname_size = 0x3f;
      name = acStack_68;
    }
    bVar1 = exist_artifact((int)obj->otyp,name);
    if (bVar1 != '\0') {
      return obj;
    }
    if (oname_size == obj->onamelth) {
      strcpy((char *)((long)obj->oextra + (long)obj->oxlth),name);
    }
    else {
      obj = realloc_obj(obj,(int)obj->oxlth,obj->oextra,oname_size,name);
    }
    artifact_exists(obj,name,'\x01');
  }
  if (obj->oartifact != '\0') {
    if (obj == uswapwep) {
      untwoweapon();
    }
    if (obj == uwep) {
      set_artifact_intrinsic(obj,'\x01',0x100,'\x01');
    }
    if ((obj->oartifact == '\x1a') && (obj->owt = 300, urole.malenum == 0x15d)) {
      obj->field_0x4b = obj->field_0x4b | 0x10;
    }
  }
  if (obj->where == '\x03') {
    update_inventory();
  }
  return obj;
}

Assistant:

struct obj *oname(struct obj *obj, const char *name)
{
	int lth;
	char buf[PL_PSIZ];

	lth = *name ? (int)(strlen(name) + 1) : 0;
	if (lth > PL_PSIZ) {
		lth = PL_PSIZ;
		name = strncpy(buf, name, PL_PSIZ - 1);
		buf[PL_PSIZ - 1] = '\0';
	}
	/* If named artifact exists in the game, do not create another.
	 * Also trying to create an artifact shouldn't de-artifact
	 * it (e.g. Excalibur from prayer). In this case the object
	 * will retain its current name. */
	if (obj->oartifact || (lth && exist_artifact(obj->otyp, name)))
		return obj;

	if (lth == obj->onamelth) {
		/* no need to replace entire object */
		if (lth) strcpy(ONAME(obj), name);
	} else {
		obj = realloc_obj(obj, obj->oxlth,
			      obj->oextra, lth, name);
	}
	if (lth) artifact_exists(obj, name, TRUE);
	if (obj->oartifact) {
	    /* can't dual-wield with artifact as secondary weapon */
	    if (obj == uswapwep) untwoweapon();
	    /* activate warning if you've just named your weapon "Sting" */
	    if (obj == uwep) set_artifact_intrinsic(obj, TRUE, W_WEP, TRUE);
	    /* The Iron Ball of Liberation is rustproof only for convicts. */
	    if (obj->oartifact == ART_IRON_BALL_OF_LIBERATION) {
		obj->owt = 300;	/* magically lightened, but still heavy */
		if (Role_if(PM_CONVICT)) obj->oerodeproof = TRUE;
	    }
	}
	if (carried(obj)) update_inventory();
	return obj;
}